

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_smooth.c
# Opt level: O0

REF_STATUS ref_smooth_tri_weighted_ideal(REF_GRID ref_grid,REF_INT node,REF_DBL *ideal_location)

{
  REF_DBL *pRVar1;
  uint uVar2;
  double local_110;
  REF_INT local_104;
  double local_100;
  REF_INT local_f4;
  int local_f0;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL normalization;
  REF_DBL weight;
  REF_DBL quality;
  REF_DBL tri_ideal [3];
  REF_INT local_a8;
  REF_INT ixyz;
  REF_INT nodes [27];
  REF_INT local_30;
  int local_2c;
  REF_INT cell;
  REF_INT item;
  REF_DBL *ideal_location_local;
  REF_INT node_local;
  REF_GRID ref_grid_local;
  
  _ref_private_macro_code_rss_1 = 0.0;
  for (tri_ideal[2]._4_4_ = 0; tri_ideal[2]._4_4_ < 3; tri_ideal[2]._4_4_ = tri_ideal[2]._4_4_ + 1)
  {
    ideal_location[tri_ideal[2]._4_4_] = 0.0;
  }
  if ((node < 0) || (ref_grid->cell[3]->ref_adj->nnode <= node)) {
    local_f0 = -1;
  }
  else {
    local_f0 = ref_grid->cell[3]->ref_adj->first[node];
  }
  local_2c = local_f0;
  if (local_f0 == -1) {
    local_f4 = -1;
  }
  else {
    local_f4 = ref_grid->cell[3]->ref_adj->item[local_f0].ref;
  }
  local_30 = local_f4;
  while( true ) {
    if (local_2c == -1) {
      if (_ref_private_macro_code_rss_1 * 1e+20 <= 0.0) {
        local_110 = -(_ref_private_macro_code_rss_1 * 1e+20);
      }
      else {
        local_110 = _ref_private_macro_code_rss_1 * 1e+20;
      }
      if (local_110 <= 1.0) {
        printf("normalization = %e at %e %e %e\n",_ref_private_macro_code_rss_1,
               ref_grid->node->real[node * 0xf],ref_grid->node->real[node * 0xf + 1],
               ref_grid->node->real[node * 0xf + 2]);
        ref_grid_local._4_4_ = 4;
      }
      else {
        for (tri_ideal[2]._4_4_ = 0; tri_ideal[2]._4_4_ < 3;
            tri_ideal[2]._4_4_ = tri_ideal[2]._4_4_ + 1) {
          ideal_location[tri_ideal[2]._4_4_] =
               (1.0 / _ref_private_macro_code_rss_1) * ideal_location[tri_ideal[2]._4_4_];
        }
        ref_grid_local._4_4_ = 0;
      }
      return ref_grid_local._4_4_;
    }
    uVar2 = ref_smooth_tri_ideal(ref_grid,node,local_30,&quality);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
             0x222,"ref_smooth_tri_weighted_ideal",(ulong)uVar2,"tri ideal");
      return uVar2;
    }
    uVar2 = ref_cell_nodes(ref_grid->cell[3],local_30,&local_a8);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
             0x223,"ref_smooth_tri_weighted_ideal",(ulong)uVar2,"nodes");
      return uVar2;
    }
    uVar2 = ref_node_tri_quality(ref_grid->node,&local_a8,&weight);
    if (uVar2 != 0) break;
    pRVar1 = &ref_grid->adapt->smooth_min_quality;
    if (weight < *pRVar1 || weight == *pRVar1) {
      local_100 = ref_grid->adapt->smooth_min_quality;
    }
    else {
      local_100 = weight;
    }
    weight = local_100;
    _ref_private_macro_code_rss_1 = 1.0 / local_100 + _ref_private_macro_code_rss_1;
    for (tri_ideal[2]._4_4_ = 0; tri_ideal[2]._4_4_ < 3; tri_ideal[2]._4_4_ = tri_ideal[2]._4_4_ + 1
        ) {
      ideal_location[tri_ideal[2]._4_4_] =
           (1.0 / local_100) * tri_ideal[(long)tri_ideal[2]._4_4_ + -1] +
           ideal_location[tri_ideal[2]._4_4_];
    }
    local_2c = ref_grid->cell[3]->ref_adj->item[local_2c].next;
    if (local_2c == -1) {
      local_104 = -1;
    }
    else {
      local_104 = ref_grid->cell[3]->ref_adj->item[local_2c].ref;
    }
    local_30 = local_104;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",0x225,
         "ref_smooth_tri_weighted_ideal",(ulong)uVar2,"tri qual");
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_smooth_tri_weighted_ideal(REF_GRID ref_grid,
                                                 REF_INT node,
                                                 REF_DBL *ideal_location) {
  REF_INT item, cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT ixyz;
  REF_DBL tri_ideal[3];
  REF_DBL quality, weight, normalization;

  normalization = 0.0;
  for (ixyz = 0; ixyz < 3; ixyz++) ideal_location[ixyz] = 0.0;

  each_ref_cell_having_node(ref_grid_tri(ref_grid), node, item, cell) {
    RSS(ref_smooth_tri_ideal(ref_grid, node, cell, tri_ideal), "tri ideal");
    RSS(ref_cell_nodes(ref_grid_tri(ref_grid), cell, nodes), "nodes");
    RSS(ref_node_tri_quality(ref_grid_node(ref_grid), nodes, &quality),
        "tri qual");
    quality = MAX(quality, ref_grid_adapt(ref_grid, smooth_min_quality));
    weight = 1.0 / quality;
    normalization += weight;
    for (ixyz = 0; ixyz < 3; ixyz++)
      ideal_location[ixyz] += weight * tri_ideal[ixyz];
  }

  if (ref_math_divisible(1.0, normalization)) {
    for (ixyz = 0; ixyz < 3; ixyz++)
      ideal_location[ixyz] = (1.0 / normalization) * ideal_location[ixyz];
  } else {
    printf("normalization = %e at %e %e %e\n", normalization,
           ref_node_xyz(ref_grid_node(ref_grid), 0, node),
           ref_node_xyz(ref_grid_node(ref_grid), 1, node),
           ref_node_xyz(ref_grid_node(ref_grid), 2, node));
    return REF_DIV_ZERO;
  }

  return REF_SUCCESS;
}